

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  pointer pcVar1;
  cmake *pcVar2;
  char *pcVar3;
  string *psVar4;
  char **ppcVar5;
  ostream *poVar6;
  size_t sVar7;
  char **ppcVar8;
  bool bVar9;
  char *pcVar10;
  char **ppcVar11;
  bool needCxx20;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  ostringstream e;
  bool local_215;
  bool local_214;
  bool local_213;
  bool local_212;
  bool local_211;
  string local_210;
  string *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_211 = false;
  local_212 = false;
  local_213 = false;
  local_214 = false;
  local_215 = false;
  CheckNeededCxxLanguage(this,feature,&local_211,&local_212,&local_213,&local_214,&local_215);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CXX_STANDARD","");
  pcVar3 = cmTarget::GetProperty(target,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar3 == (char *)0x0) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_CXX_STANDARD_DEFAULT","");
    psVar4 = GetDef(this,(string *)local_1a8);
    if (psVar4 == (string *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (psVar4->_M_dataplus)._M_p;
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar3 = (char *)0x0;
    if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
      pcVar3 = pcVar10;
    }
  }
  local_1f0 = error;
  if (pcVar3 == (char *)0x0) {
    ppcVar5 = (char **)0x0;
LAB_0023af39:
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CUDA_STANDARD","");
    pcVar3 = cmTarget::GetProperty(target,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar3 == (char *)0x0) {
      ppcVar8 = (char **)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,pcVar3,(allocator<char> *)local_1a8);
      ppcVar8 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                           (cmStrCmp *)local_1e8);
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      if (ppcVar8 == (char **)&cmMSVC60LinkLineComputer::vtable) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The CUDA_STANDARD property on target \"",0x26);
        psVar4 = cmTarget::GetName_abi_cxx11_(target);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\" contained an invalid value: \"",0x1f);
        sVar7 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
        psVar4 = local_1f0;
        if (local_1f0 != (string *)0x0) {
          std::__cxx11::stringbuf::str();
          goto LAB_0023b089;
        }
        pcVar2 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_210,&this->Backtrace);
        goto LAB_0023b175;
      }
    }
    if (local_215 == false) {
      if (local_214 == false) {
        if (local_213 == false) {
          if (local_212 == false) {
            ppcVar11 = (char **)0x0;
            if (local_211 != false) {
              ppcVar11 = CXX_STANDARDS;
            }
          }
          else {
            ppcVar11 = CXX_STANDARDS + 1;
          }
        }
        else {
          ppcVar11 = CXX_STANDARDS + 2;
        }
      }
      else {
        ppcVar11 = CXX_STANDARDS + 3;
      }
    }
    else {
      ppcVar11 = CXX_STANDARDS + 4;
    }
    bVar9 = true;
    if (ppcVar11 != (char **)0x0) {
      if (ppcVar5 < ppcVar11) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CXX_STANDARD","");
        cmTarget::SetProperty(target,(string *)local_1a8,*ppcVar11);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if (ppcVar8 < ppcVar11) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CUDA_STANDARD","");
        cmTarget::SetProperty(target,(string *)local_1a8,*ppcVar11);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,pcVar3,(allocator<char> *)local_1a8);
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                         (cmStrCmp *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (ppcVar5 != (char **)&cmMSVC60LinkLineComputer::vtable) goto LAB_0023af39;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The CXX_STANDARD property on target \"",0x25);
    psVar4 = cmTarget::GetName_abi_cxx11_(target);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\" contained an invalid value: \"",0x1f);
    sVar7 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
    psVar4 = local_1f0;
    if (local_1f0 == (string *)0x0) {
      pcVar2 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_210,&this->Backtrace);
    }
    else {
      std::__cxx11::stringbuf::str();
LAB_0023b089:
      std::__cxx11::string::operator=((string *)psVar4,(string *)&local_210);
    }
LAB_0023b175:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;
  bool needCxx20 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17, needCxx20);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard == nullptr) {
    const char* defaultCxxStandard =
      this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
    if (defaultCxxStandard && *defaultCxxStandard) {
      existingCxxStandard = defaultCxxStandard;
    }
  }
  const char* const* existingCxxLevel = nullptr;
  if (existingCxxStandard) {
    existingCxxLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard));
    if (existingCxxLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  const char* existingCudaStandard = target->GetProperty("CUDA_STANDARD");
  const char* const* existingCudaLevel = nullptr;
  if (existingCudaStandard) {
    existingCudaLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCudaStandard));
    if (existingCudaLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CUDA_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCudaStandard
        << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  /* clang-format off */
  const char* const* needCxxLevel =
    needCxx20 ? &CXX_STANDARDS[4]
    : needCxx17 ? &CXX_STANDARDS[3]
    : needCxx14 ? &CXX_STANDARDS[2]
    : needCxx11 ? &CXX_STANDARDS[1]
    : needCxx98 ? &CXX_STANDARDS[0]
    : nullptr;
  /* clang-format on */

  if (needCxxLevel) {
    // Ensure the C++ language level is high enough to support
    // the needed C++ features.
    if (!existingCxxLevel || existingCxxLevel < needCxxLevel) {
      target->SetProperty("CXX_STANDARD", *needCxxLevel);
    }

    // Ensure the CUDA language level is high enough to support
    // the needed C++ features.
    if (!existingCudaLevel || existingCudaLevel < needCxxLevel) {
      target->SetProperty("CUDA_STANDARD", *needCxxLevel);
    }
  }

  return true;
}